

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O3

int mp_reduce_is_2k(mp_int *a)

{
  uint uVar1;
  bool bVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  
  uVar1 = a->used;
  uVar4 = uVar1;
  if ((1 < uVar1) && (uVar4 = 1, 1 < (int)uVar1)) {
    iVar6 = (uVar1 - 1) * 0x3c;
    uVar7 = a->dp[uVar1 - 1];
    lVar3 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    iVar5 = (iVar6 + 0x40) - ((uint)lVar3 ^ 0x3f);
    if (uVar7 == 0) {
      iVar5 = iVar6;
    }
    if (0x3c < iVar5) {
      iVar5 = iVar5 + -0x3c;
      uVar7 = 1;
      do {
        if ((a->dp[uVar4] & uVar7) == 0) {
          return 0;
        }
        uVar7 = uVar7 * 2;
        bVar2 = uVar7 >> 0x3c != 0;
        if (bVar2) {
          uVar7 = 1;
        }
        uVar4 = uVar4 + bVar2;
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
      return 1;
    }
  }
  return uVar4;
}

Assistant:

int mp_reduce_is_2k(mp_int *a)
{
   int ix, iy, iw;
   mp_digit iz;
   
   if (a->used == 0) {
      return MP_NO;
   } else if (a->used == 1) {
      return MP_YES;
   } else if (a->used > 1) {
      iy = mp_count_bits(a);
      iz = 1;
      iw = 1;
    
      /* Test every bit from the second digit up, must be 1 */
      for (ix = DIGIT_BIT; ix < iy; ix++) {
          if ((a->dp[iw] & iz) == 0) {
             return MP_NO;
          }
          iz <<= 1;
          if (iz > (mp_digit)MP_MASK) {
             ++iw;
             iz = 1;
          }
      }
   }
   return MP_YES;
}